

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btCompoundCollisionAlgorithm::processCollision
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  uint uVar1;
  btCollisionShape *pbVar2;
  btDbvt *this_00;
  btCollisionAlgorithm *pbVar3;
  long *plVar4;
  btTransform *pbVar5;
  btDispatcher *pbVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  btCollisionObjectWrapper *pbVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  btCollisionObjectWrapper *pbVar14;
  long lVar15;
  ulong uVar16;
  int m;
  long lVar17;
  btVector3 localAabbMin;
  btVector3 localAabbMax;
  btDbvtVolume bounds;
  btCompoundLeafCallback callback;
  btManifoldArray manifoldArray;
  btTransform local_a0;
  btVector3 aabbMax1;
  btVector3 aabbMin1;
  btVector3 aabbMax0;
  
  pbVar14 = body1Wrap;
  pbVar9 = body0Wrap;
  if (this->m_isSwapped != false) {
    pbVar14 = body0Wrap;
    pbVar9 = body1Wrap;
  }
  pbVar2 = pbVar9->m_shape;
  if (pbVar2[3].m_shapeType != this->m_compoundShapeRevision) {
    removeChildAlgorithms(this);
    preallocateChildAlgorithms(this,body0Wrap,body1Wrap);
    this->m_compoundShapeRevision = pbVar2[3].m_shapeType;
  }
  iVar11 = (this->m_childCollisionAlgorithms).m_size;
  if (iVar11 != 0) {
    this_00 = (btDbvt *)pbVar2[3]._vptr_btCollisionShape;
    callback.m_dispatcher =
         (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
    callback.m_childCollisionAlgorithms = (this->m_childCollisionAlgorithms).m_data;
    callback.m_sharedManifold = this->m_sharedManifold;
    callback.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_001ed058;
    manifoldArray.m_ownsMemory = true;
    manifoldArray.m_data = (btPersistentManifold **)0x0;
    manifoldArray.m_size = 0;
    manifoldArray.m_capacity = 0;
    callback.m_compoundColObjWrap = pbVar9;
    callback.m_otherObjWrap = pbVar14;
    callback.m_dispatchInfo = dispatchInfo;
    callback.m_resultOut = resultOut;
    for (lVar15 = 0; lVar15 < iVar11; lVar15 = lVar15 + 1) {
      pbVar3 = (this->m_childCollisionAlgorithms).m_data[lVar15];
      if (pbVar3 != (btCollisionAlgorithm *)0x0) {
        (*pbVar3->_vptr_btCollisionAlgorithm[4])();
        for (lVar17 = 0; lVar17 < manifoldArray.m_size; lVar17 = lVar17 + 1) {
          if (manifoldArray.m_data[lVar17]->m_cachedPoints != 0) {
            resultOut->m_manifoldPtr = manifoldArray.m_data[lVar17];
            btManifoldResult::refreshContactPoints(resultOut);
            resultOut->m_manifoldPtr = (btPersistentManifold *)0x0;
          }
        }
        bounds.mi.m_floats[0] = 0.0;
        bounds.mi.m_floats[1] = 0.0;
        btAlignedObjectArray<btPersistentManifold_*>::resize
                  (&manifoldArray,0,(btPersistentManifold **)&bounds);
        iVar11 = (this->m_childCollisionAlgorithms).m_size;
      }
    }
    btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray(&manifoldArray);
    if (this_00 == (btDbvt *)0x0) {
      uVar1 = (this->m_childCollisionAlgorithms).m_size;
      uVar16 = 0;
      uVar12 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar12 = uVar16;
      }
      lVar15 = 0x40;
      for (; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        btCompoundLeafCallback::ProcessChildShape
                  (&callback,*(btCollisionShape **)((long)pbVar2[1].m_userPointer + lVar15),
                   (int)uVar16);
        lVar15 = lVar15 + 0x58;
      }
    }
    else {
      btTransform::inverse(&local_a0,pbVar9->m_worldTransform);
      btTransform::operator*((btTransform *)&bounds,&local_a0,pbVar14->m_worldTransform);
      manifoldArray._0_4_ = bounds.mi.m_floats[0];
      manifoldArray.m_size = (int)bounds.mi.m_floats[1];
      manifoldArray.m_capacity = (int)bounds.mi.m_floats[2];
      manifoldArray._12_4_ = bounds.mi.m_floats[3];
      manifoldArray.m_data = (btPersistentManifold **)bounds.mx.m_floats._0_8_;
      manifoldArray._24_4_ = bounds.mx.m_floats[2];
      manifoldArray._28_4_ = bounds.mx.m_floats[3];
      (*pbVar14->m_shape->_vptr_btCollisionShape[2])
                (pbVar14->m_shape,&manifoldArray,&localAabbMin,&localAabbMax);
      bounds.mi.m_floats[1] = localAabbMin.m_floats[1];
      bounds.mi.m_floats[0] = localAabbMin.m_floats[0];
      bounds.mi.m_floats[3] = localAabbMin.m_floats[3];
      bounds.mi.m_floats[2] = localAabbMin.m_floats[2];
      bounds.mx.m_floats[0] = localAabbMax.m_floats[0];
      bounds.mx.m_floats[1] = localAabbMax.m_floats[1];
      bounds.mx.m_floats[2] = localAabbMax.m_floats[2];
      bounds.mx.m_floats[3] = localAabbMax.m_floats[3];
      btDbvt::collideTV(this_00,this_00->m_root,&bounds,&callback.super_ICollide);
    }
    uVar1 = (this->m_childCollisionAlgorithms).m_size;
    localAabbMin.m_floats[1] = 0.0;
    localAabbMin.m_floats[2] = 0.0;
    uVar16 = 0;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar12 = uVar16;
    }
    for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      if ((this->m_childCollisionAlgorithms).m_data[uVar13] != (btCollisionAlgorithm *)0x0) {
        plVar4 = *(long **)((long)pbVar2[1].m_userPointer + uVar16 + 0x40);
        pbVar5 = pbVar9->m_worldTransform;
        uVar7 = *(undefined8 *)(pbVar5->m_basis).m_el[0].m_floats;
        uVar8 = *(undefined8 *)((pbVar5->m_basis).m_el[0].m_floats + 2);
        manifoldArray._0_4_ = SUB84(uVar7,0);
        manifoldArray.m_size = (int)((ulong)uVar7 >> 0x20);
        manifoldArray.m_capacity = (int)uVar8;
        manifoldArray._12_4_ = SUB84((ulong)uVar8 >> 0x20,0);
        manifoldArray.m_data = *(btPersistentManifold ***)(pbVar5->m_basis).m_el[1].m_floats;
        manifoldArray._24_8_ = *(undefined8 *)((pbVar5->m_basis).m_el[1].m_floats + 2);
        btTransform::operator*
                  (&local_a0,(btTransform *)&manifoldArray,
                   (btTransform *)((long)pbVar2[1].m_userPointer + uVar16));
        bounds.mi.m_floats[0] = local_a0.m_basis.m_el[0].m_floats[0];
        bounds.mi.m_floats[1] = local_a0.m_basis.m_el[0].m_floats[1];
        bounds.mi.m_floats[2] = local_a0.m_basis.m_el[0].m_floats[2];
        bounds.mi.m_floats[3] = local_a0.m_basis.m_el[0].m_floats[3];
        bounds.mx.m_floats[0] = local_a0.m_basis.m_el[1].m_floats[0];
        bounds.mx.m_floats[1] = local_a0.m_basis.m_el[1].m_floats[1];
        bounds.mx.m_floats[2] = local_a0.m_basis.m_el[1].m_floats[2];
        bounds.mx.m_floats[3] = local_a0.m_basis.m_el[1].m_floats[3];
        (**(code **)(*plVar4 + 0x10))(plVar4,&bounds,&localAabbMax,&aabbMax0);
        (*pbVar14->m_shape->_vptr_btCollisionShape[2])
                  (pbVar14->m_shape,pbVar14->m_worldTransform,&aabbMin1,&aabbMax1);
        bVar10 = TestAabbAgainstAabb2(&localAabbMax,&aabbMax0,&aabbMin1,&aabbMax1);
        if (!bVar10) {
          (**(this->m_childCollisionAlgorithms).m_data[uVar13]->_vptr_btCollisionAlgorithm)();
          pbVar6 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.
                   m_dispatcher;
          (*pbVar6->_vptr_btDispatcher[0xf])
                    (pbVar6,(this->m_childCollisionAlgorithms).m_data[uVar13]);
          (this->m_childCollisionAlgorithms).m_data[uVar13] = (btCollisionAlgorithm *)0x0;
        }
      }
      uVar16 = uVar16 + 0x58;
    }
    btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<btPersistentManifold_*> *)&localAabbMin);
  }
  return;
}

Assistant:

void btCompoundCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;

	btAssert (colObjWrap->getCollisionShape()->isCompound());
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	///btCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if (compoundShape->getUpdateRevision() != m_compoundShapeRevision)
	{
		///clear and update all
		removeChildAlgorithms();
		
		preallocateChildAlgorithms(body0Wrap,body1Wrap);
		m_compoundShapeRevision = compoundShape->getUpdateRevision();
	}

    if (m_childCollisionAlgorithms.size()==0)
        return;
    
	const btDbvt* tree = compoundShape->getDynamicAabbTree();
	//use a dynamic aabb tree to cull potential child-overlaps
	btCompoundLeafCallback  callback(colObjWrap,otherObjWrap,m_dispatcher,dispatchInfo,resultOut,&m_childCollisionAlgorithms[0],m_sharedManifold);

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, btCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the btCollisionAlgorithm
	{
		int i;
		btManifoldArray manifoldArray;
		for (i=0;i<m_childCollisionAlgorithms.size();i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				m_childCollisionAlgorithms[i]->getAllContactManifolds(manifoldArray);
				for (int m=0;m<manifoldArray.size();m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);//??necessary?
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	if (tree)
	{

		btVector3 localAabbMin,localAabbMax;
		btTransform otherInCompoundSpace;
		otherInCompoundSpace = colObjWrap->getWorldTransform().inverse() * otherObjWrap->getWorldTransform();
		otherObjWrap->getCollisionShape()->getAabb(otherInCompoundSpace,localAabbMin,localAabbMax);

		const ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
		//process all children, that overlap with  the given AABB bounds
		tree->collideTV(tree->m_root,bounds,callback);

	} else
	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		for (i=0;i<numChildren;i++)
		{
			callback.ProcessChildShape(compoundShape->getChildShape(i),i);
		}
	}

	{
				//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		btManifoldArray	manifoldArray;
        const btCollisionShape* childShape = 0;
        btTransform	orgTrans;
        
        btTransform	newChildWorldTrans;
        btVector3 aabbMin0,aabbMax0,aabbMin1,aabbMax1;        
        
		for (i=0;i<numChildren;i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				childShape = compoundShape->getChildShape(i);
			//if not longer overlapping, remove the algorithm
				orgTrans = colObjWrap->getWorldTransform();
                
				const btTransform& childTrans = compoundShape->getChildTransform(i);
                newChildWorldTrans = orgTrans*childTrans ;

				//perform an AABB check first
				childShape->getAabb(newChildWorldTrans,aabbMin0,aabbMax0);
				otherObjWrap->getCollisionShape()->getAabb(otherObjWrap->getWorldTransform(),aabbMin1,aabbMax1);

				if (!TestAabbAgainstAabb2(aabbMin0,aabbMax0,aabbMin1,aabbMax1))
				{
					m_childCollisionAlgorithms[i]->~btCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
					m_childCollisionAlgorithms[i] = 0;
				}
			}
		}
	}
}